

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

size_t mdns_record_parse_txt
                 (void *buffer,size_t size,size_t offset,size_t length,mdns_record_txt_t *records,
                 size_t capacity)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  
  uVar1 = length + offset;
  if (size <= length + offset) {
    uVar1 = size;
  }
  if (capacity != 0) {
    sVar2 = 0;
    do {
      do {
        if (uVar1 <= offset) {
          return sVar2;
        }
        pbVar4 = (byte *)((long)buffer + offset) + 1;
        uVar3 = (ulong)*(byte *)((long)buffer + offset);
        if (uVar3 != 0) {
          uVar5 = 0;
          do {
            if ((byte)(pbVar4[uVar5] + 0x81) < 0xa1) break;
            if (pbVar4[uVar5] == 0x3d) goto LAB_002d0c1f;
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        uVar5 = 0;
LAB_002d0c1f:
        offset = offset + uVar3 + 1;
      } while (uVar5 == 0);
      records[sVar2].key.str = (char *)pbVar4;
      if (uVar5 < uVar3) {
        records[sVar2].key.length = uVar5;
        records[sVar2].value.str = (char *)(pbVar4 + uVar5 + 1);
        records[sVar2].value.length = ~uVar5 + uVar3;
      }
      else {
        records[sVar2].key.length = uVar3;
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != capacity);
  }
  return capacity;
}

Assistant:

size_t
mdns_record_parse_txt(const void* buffer, size_t size, size_t offset, size_t length,
                      mdns_record_txt_t* records, size_t capacity) {
	size_t parsed = 0;
	const char* strdata;
	size_t separator, sublength;
	size_t end = offset + length;

	if (size < end)
		end = size;

	while ((offset < end) && (parsed < capacity)) {
		strdata = (const char*)buffer + offset;
		sublength = *(const unsigned char*)strdata;

		++strdata;
		offset += sublength + 1;

		separator = 0;
		for (size_t c = 0; c < sublength; ++c) {
			//DNS-SD TXT record keys MUST be printable US-ASCII, [0x20, 0x7E]
			if ((strdata[c] < 0x20) || (strdata[c] > 0x7E))
				break;
			if (strdata[c] == '=') {
				separator = c;
				break;
			}
		}

		if (!separator)
			continue;

		if (separator < sublength) {
			records[parsed].key.str = strdata;
			records[parsed].key.length = separator;
			records[parsed].value.str = strdata + separator + 1;
			records[parsed].value.length = sublength - (separator + 1);
		}
		else {
			records[parsed].key.str = strdata;
			records[parsed].key.length = sublength;
		}

		++parsed;
	}

	return parsed;
}